

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

pair<int_*,_bool>
HighsHashTree<int,_int>::insert_recurse
          (NodePtr *insertNode,uint64_t hash,int hashPos,HighsHashTableEntry<int,_int> *entry)

{
  int *piVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  InnerLeaf<1> *this;
  ValueType *pVVar7;
  ulong *puVar8;
  undefined8 *puVar9;
  sbyte sVar10;
  int iVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar12;
  int hashPos_00;
  ulong uVar13;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 *puVar14;
  ulong uVar15;
  Entry *pEVar16;
  int i;
  long lVar17;
  Entry *pEVar18;
  Entry *pEVar19;
  long lVar20;
  BranchNode *branch;
  InnerLeaf<4> *this_00;
  pair<int_*,_bool> pVar21;
  pair<int_*,_bool> pVar22;
  array<unsigned_char,_55UL> sizes;
  undefined8 local_70;
  byte local_68 [56];
  
  uVar13 = insertNode->ptrAndType;
  switch((uint)uVar13 & 7) {
  case 0:
    if (hashPos == 9) {
      puVar9 = (undefined8 *)operator_new(0x18);
      *puVar9 = 0;
      *(HighsHashTableEntry<int,_int> *)(puVar9 + 1) = *entry;
      *(undefined4 *)(puVar9 + 2) = 1;
      insertNode->ptrAndType = (ulong)puVar9 | 1;
      pVar22._9_7_ = (int7)((ulong)extraout_RDX >> 8);
      pVar22.second = true;
      pVar22.first = (int *)((long)puVar9 + 0xc);
    }
    else {
      this = (InnerLeaf<1> *)operator_new(0x78);
      (this->occupation).occupation = 0;
      this->size = 0;
      (this->hashes)._M_elems[0] = 0;
      insertNode->ptrAndType = (ulong)this | 2;
      pVar22 = InnerLeaf<1>::insert_entry(this,hash,hashPos,entry);
    }
    break;
  case 1:
    puVar9 = (undefined8 *)(uVar13 & 0xfffffffffffffff8);
    do {
      puVar14 = puVar9;
      if (*(int *)(puVar14 + 1) == entry->key_) {
        uVar12 = 0;
        goto LAB_002792d7;
      }
      puVar9 = (undefined8 *)*puVar14;
    } while ((undefined8 *)*puVar14 != (undefined8 *)0x0);
    puVar9 = (undefined8 *)operator_new(0x10);
    *puVar9 = 0;
    *(HighsHashTableEntry<int,_int> *)(puVar9 + 1) = *entry;
    *puVar14 = puVar9;
    piVar1 = (int *)((undefined8 *)(uVar13 & 0xfffffffffffffff8) + 2);
    *piVar1 = *piVar1 + 1;
    uVar12 = CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1);
    puVar14 = puVar9;
LAB_002792d7:
    pVar22._8_8_ = uVar12;
    pVar22.first = (int *)((long)puVar14 + 0xc);
    break;
  case 2:
    pVar22 = insert_into_leaf<1>(insertNode,(InnerLeaf<1> *)(uVar13 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 3:
    pVar22 = insert_into_leaf<2>(insertNode,(InnerLeaf<2> *)(uVar13 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 4:
    pVar22 = insert_into_leaf<3>(insertNode,(InnerLeaf<3> *)(uVar13 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 5:
    this_00 = (InnerLeaf<4> *)(uVar13 & 0xfffffffffffffff8);
    if (this_00->size < 0x36) {
      pVar21 = InnerLeaf<4>::insert_entry(this_00,hash,hashPos,entry);
      bVar3 = true;
    }
    else {
      pVVar7 = InnerLeaf<4>::find_entry(this_00,hash,hashPos,&entry->key_);
      if (pVVar7 == (ValueType *)0x0) {
        uVar6 = (uint)(hash >> ((char)hashPos * -6 + 0x3aU & 0x3f)) & 0x3f;
        uVar13 = (this_00->occupation).occupation | 1L << (ulong)uVar6;
        pEVar18 = (Entry *)POPCOUNT(uVar13);
        uVar4 = (uint)pEVar18;
        puVar8 = (ulong *)operator_new((ulong)(uVar4 * 8 + 0x47 & 0xffffffc0));
        *puVar8 = 0;
        insertNode->ptrAndType = (ulong)puVar8 | 6;
        *puVar8 = uVar13;
        hashPos_00 = hashPos + 1;
        sVar10 = (sbyte)uVar6;
        if (hashPos_00 == 9) {
          local_70 = hash;
          memset(puVar8 + 1,0,(ulong)((uVar4 + (pEVar18 == (Entry *)0x0)) * 8));
          if (0 < this_00->size) {
            lVar17 = 0;
            do {
              lVar20 = POPCOUNT(uVar13 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar17] >> 10) &
                                          0x3f));
              if ((puVar8[lVar20] & 7) == 0) {
                puVar9 = (undefined8 *)operator_new(0x18);
                *puVar9 = 0;
                *(HighsHashTableEntry<int,_int> *)(puVar9 + 1) = (this_00->entries)._M_elems[lVar17]
                ;
                *(undefined4 *)(puVar9 + 2) = 1;
                puVar8[lVar20] = (ulong)puVar9 | 1;
              }
              else {
                puVar14 = (undefined8 *)(puVar8[lVar20] & 0xfffffffffffffff8);
                puVar9 = (undefined8 *)operator_new(0x10);
                uVar12 = puVar14[1];
                *puVar9 = *puVar14;
                puVar9[1] = uVar12;
                *puVar14 = puVar9;
                *(HighsHashTableEntry<int,_int> *)(puVar14 + 1) =
                     (this_00->entries)._M_elems[lVar17];
                *(int *)(puVar14 + 2) = *(int *)(puVar14 + 2) + 1;
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < this_00->size);
          }
          operator_delete(this_00);
          if ((puVar8[POPCOUNT(uVar13 >> sVar10)] & 7) == 0) {
            puVar9 = (undefined8 *)operator_new(0x18);
            *puVar9 = 0;
            *(HighsHashTableEntry<int,_int> *)(puVar9 + 1) = *entry;
            *(undefined4 *)(puVar9 + 2) = 1;
            puVar8[POPCOUNT(uVar13 >> sVar10)] = (ulong)puVar9 | 1;
            uVar12 = extraout_RDX_03;
          }
          else {
            puVar9 = (undefined8 *)(puVar8[POPCOUNT(uVar13 >> sVar10)] & 0xfffffffffffffff8);
            puVar14 = (undefined8 *)operator_new(0x10);
            uVar12 = puVar9[1];
            *puVar14 = *puVar9;
            puVar14[1] = uVar12;
            *puVar9 = puVar14;
            *(HighsHashTableEntry<int,_int> *)(puVar9 + 1) = *entry;
            *(int *)(puVar9 + 2) = *(int *)(puVar9 + 2) + 1;
            uVar12 = extraout_RDX_01;
          }
          bVar3 = true;
          pVar21._9_7_ = (int7)((ulong)uVar12 >> 8);
          pVar21.second = true;
          pVar21.first = (int *)((long)puVar9 + 0xc);
          hash = local_70;
        }
        else if (uVar4 < 2) {
          insertNode = (NodePtr *)(puVar8 + 1);
          puVar8[1] = (ulong)this_00 | 5;
          InnerLeaf<4>::rehash(this_00,hashPos_00);
          pVar21._8_8_ = extraout_RDX_02;
          pVar21.first = (int *)pEVar18;
          bVar3 = false;
          hashPos = hashPos_00;
        }
        else {
          uVar6 = this_00->size;
          iVar11 = (uVar6 - uVar4) + 2;
          bVar3 = iVar11 < 7;
          if (SBORROW4(iVar11,7) == (int)((uVar6 - uVar4) + -5) < 0) {
            local_68[0x20] = 0;
            local_68[0x21] = 0;
            local_68[0x22] = 0;
            local_68[0x23] = 0;
            local_68[0x24] = 0;
            local_68[0x25] = 0;
            local_68[0x26] = 0;
            local_68[0x27] = 0;
            local_68[0x28] = 0;
            local_68[0x29] = 0;
            local_68[0x2a] = 0;
            local_68[0x2b] = 0;
            local_68[0x2c] = 0;
            local_68[0x2d] = 0;
            local_68[0x2e] = 0;
            local_68[0x10] = 0;
            local_68[0x11] = 0;
            local_68[0x12] = 0;
            local_68[0x13] = 0;
            local_68[0x14] = 0;
            local_68[0x15] = 0;
            local_68[0x16] = 0;
            local_68[0x17] = 0;
            local_68[0x18] = 0;
            local_68[0x19] = 0;
            local_68[0x1a] = 0;
            local_68[0x1b] = 0;
            local_68[0x1c] = 0;
            local_68[0x1d] = 0;
            local_68[0x1e] = 0;
            local_68[0x1f] = 0;
            local_68[0] = 0;
            local_68[1] = 0;
            local_68[2] = 0;
            local_68[3] = 0;
            local_68[4] = 0;
            local_68[5] = 0;
            local_68[6] = 0;
            local_68[7] = 0;
            local_68[8] = 0;
            local_68[9] = 0;
            local_68[10] = 0;
            local_68[0xb] = 0;
            local_68[0xc] = 0;
            local_68[0xd] = 0;
            local_68[0xe] = 0;
            local_68[0xf] = 0;
            local_68[0x2f] = 0;
            local_68[0x30] = 0;
            local_68[0x31] = 0;
            local_68[0x32] = 0;
            local_68[0x33] = 0;
            local_68[0x34] = 0;
            local_68[0x35] = 0;
            local_68[0x36] = 0;
            pcVar2 = (char *)((long)&local_70 + POPCOUNT(uVar13 >> sVar10) + 7);
            *pcVar2 = *pcVar2 + '\x01';
            if (0 < (int)uVar6) {
              uVar15 = 0;
              do {
                pcVar2 = (char *)((long)&local_70 +
                                 POPCOUNT(uVar13 >> ((byte)((uint)(this_00->hashes)._M_elems[uVar15]
                                                           >> 10) & 0x3f)) + 7);
                *pcVar2 = *pcVar2 + '\x01';
                uVar15 = uVar15 + 1;
              } while (uVar6 != uVar15);
            }
            pEVar16 = (Entry *)(ulong)(uVar4 + (uVar4 == 0));
            pEVar19 = (Entry *)0x0;
            do {
              switch(local_68[(long)pEVar19] + 9 >> 4) {
              case 0:
                puVar9 = (undefined8 *)operator_new(0x78);
                uVar15 = 2;
                break;
              case 1:
                puVar9 = (undefined8 *)operator_new(0x178);
                uVar15 = 3;
                break;
              case 2:
                puVar9 = (undefined8 *)operator_new(0x278);
                uVar15 = 4;
                break;
              case 3:
                puVar9 = (undefined8 *)operator_new(0x378);
                uVar15 = 5;
                break;
              default:
                goto switchD_00279750_default;
              }
              *puVar9 = 0;
              *(undefined4 *)(puVar9 + 1) = 0;
              puVar9[2] = 0;
              puVar8[(long)((long)&pEVar19->key_ + 1)] = uVar15 | (ulong)puVar9;
              pEVar18 = pEVar16;
switchD_00279750_default:
              pEVar19 = (Entry *)((long)&pEVar19->key_ + 1);
            } while (pEVar16 != pEVar19);
            if (0 < this_00->size) {
              pEVar18 = (this_00->entries)._M_elems;
              lVar17 = 0;
              do {
                uVar15 = puVar8[POPCOUNT(uVar13 >> ((byte)((uint)pEVar18[-0x37].key_ >> 10) & 0x3f))
                               ];
                switch((uint)uVar15 & 7) {
                case 2:
                  InnerLeaf<1>::insert_entry
                            ((InnerLeaf<1> *)(uVar15 & 0xfffffffffffffff8),
                             (ulong)(uint)pEVar18->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3
                             >> 0x20 ^ (ulong)(uint)pEVar18->key_ * -0x75e7c76a1153eaca +
                                       0x1da24fc66dd63e32,hashPos_00,pEVar18);
                  break;
                case 3:
                  InnerLeaf<2>::insert_entry
                            ((InnerLeaf<2> *)(uVar15 & 0xfffffffffffffff8),
                             (ulong)(uint)pEVar18->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3
                             >> 0x20 ^ (ulong)(uint)pEVar18->key_ * -0x75e7c76a1153eaca +
                                       0x1da24fc66dd63e32,hashPos_00,pEVar18);
                  break;
                case 4:
                  InnerLeaf<3>::insert_entry
                            ((InnerLeaf<3> *)(uVar15 & 0xfffffffffffffff8),
                             (ulong)(uint)pEVar18->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3
                             >> 0x20 ^ (ulong)(uint)pEVar18->key_ * -0x75e7c76a1153eaca +
                                       0x1da24fc66dd63e32,hashPos_00,pEVar18);
                  break;
                case 5:
                  InnerLeaf<4>::insert_entry
                            ((InnerLeaf<4> *)(uVar15 & 0xfffffffffffffff8),
                             (ulong)(uint)pEVar18->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3
                             >> 0x20 ^ (ulong)(uint)pEVar18->key_ * -0x75e7c76a1153eaca +
                                       0x1da24fc66dd63e32,hashPos_00,pEVar18);
                }
                lVar17 = lVar17 + 1;
                pEVar18 = pEVar18 + 1;
              } while (lVar17 < this_00->size);
            }
            operator_delete(this_00);
            pVar21._8_8_ = extraout_RDX_04;
            pVar21.first = &pEVar18->key_;
            insertNode = (NodePtr *)(puVar8 + POPCOUNT(uVar13 >> sVar10));
            hashPos = hashPos_00;
          }
          else {
            pEVar16 = (Entry *)0x0;
            local_70 = hash;
            do {
              puVar9 = (undefined8 *)operator_new(0x78);
              *puVar9 = 0;
              *(undefined4 *)(puVar9 + 1) = 0;
              puVar9[2] = 0;
              puVar8[(long)((long)&pEVar16->key_ + 1)] = (ulong)puVar9 | 2;
              pEVar16 = (Entry *)((long)&pEVar16->key_ + 1);
            } while (pEVar18 != pEVar16);
            if (0 < this_00->size) {
              pEVar18 = (this_00->entries)._M_elems;
              lVar17 = 0;
              do {
                InnerLeaf<1>::insert_entry
                          ((InnerLeaf<1> *)
                           (puVar8[POPCOUNT(uVar13 >> ((byte)((uint)pEVar18[-0x37].key_ >> 10) &
                                                      0x3f))] & 0xfffffffffffffff8),
                           (ulong)(uint)pEVar18->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                           0x20 ^ (ulong)(uint)pEVar18->key_ * -0x75e7c76a1153eaca +
                                  0x1da24fc66dd63e32,hashPos_00,pEVar18);
                lVar17 = lVar17 + 1;
                pEVar18 = pEVar18 + 1;
              } while (lVar17 < this_00->size);
            }
            operator_delete(this_00);
            hash = local_70;
            pVar21 = InnerLeaf<1>::insert_entry
                               ((InnerLeaf<1> *)
                                (puVar8[POPCOUNT(uVar13 >> sVar10)] & 0xfffffffffffffff8),local_70,
                                hashPos_00,entry);
          }
        }
      }
      else {
        bVar3 = true;
        pVar21._8_8_ = 0;
        pVar21.first = pVVar7;
      }
    }
    if (bVar3) {
      return pVar21;
    }
  case 7:
switchD_0027918a_caseD_7:
    pVar22 = insert_recurse(insertNode,hash,hashPos,entry);
    break;
  case 6:
    uVar15 = hash >> ((char)hashPos * -6 + 0x3aU & 0x3f);
    branch = (BranchNode *)(uVar13 & 0xfffffffffffffff8);
    uVar13 = (branch->occupation).occupation;
    bVar5 = (byte)uVar15;
    lVar17 = POPCOUNT(uVar13 >> (bVar5 & 0x3f));
    if ((uVar13 >> (uVar15 & 0x3f) & 1) == 0) {
      branch = addChildToBranchNode(branch,bVar5 & 0x3f,(int)lVar17);
      branch->child[lVar17].ptrAndType = 0;
      (branch->occupation).occupation = (branch->occupation).occupation | 1L << (bVar5 & 0x3f);
    }
    else {
      lVar17 = lVar17 + -1;
    }
    insertNode->ptrAndType = (ulong)branch | 6;
    hashPos = hashPos + 1;
    insertNode = branch->child + lVar17;
    goto switchD_0027918a_caseD_7;
  }
  return pVar22;
}

Assistant:

static std::pair<ValueType*, bool> insert_recurse(
      NodePtr* insertNode, uint64_t hash, int hashPos,
      HighsHashTableEntry<K, V>& entry) {
    switch (insertNode->getType()) {
      case kEmpty: {
        if (hashPos == kMaxDepth) {
          ListLeaf* leaf = new ListLeaf(std::move(entry));
          *insertNode = leaf;
          return std::make_pair(&leaf->first.entry.value(), true);
        } else {
          InnerLeaf<1>* leaf = new InnerLeaf<1>;
          *insertNode = leaf;
          return leaf->insert_entry(hash, hashPos, entry);
        }
      }
      case kListLeaf: {
        ListLeaf* leaf = insertNode->getListLeaf();
        ListNode* iter = &leaf->first;
        while (true) {
          // check for existing key
          if (iter->entry.key() == entry.key())
            return std::make_pair(&iter->entry.value(), false);

          if (iter->next == nullptr) {
            // reached the end of the list and key is not duplicate, so insert
            iter->next = new ListNode(std::move(entry));
            ++leaf->count;
            return std::make_pair(&iter->next->entry.value(), true);
          }
          iter = iter->next;
        }

        break;
      }
      case kInnerLeafSizeClass1:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass1(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass2:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass2(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass3:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass3(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = insertNode->getInnerLeafSizeClass4();
        if (leaf->size < InnerLeaf<4>::capacity())
          return leaf->insert_entry(hash, hashPos, entry);

        auto existingEntry = leaf->find_entry(hash, hashPos, entry.key());
        if (existingEntry) return std::make_pair(existingEntry, false);
        Occupation occupation = leaf->occupation;

        uint8_t hashChunk = get_hash_chunk(hash, hashPos);
        occupation.set(hashChunk);

        int branchSize = occupation.num_set();

        BranchNode* branch = createBranchingNode(branchSize);
        *insertNode = branch;
        branch->occupation = occupation;

        if (hashPos + 1 == kMaxDepth) {
          for (int i = 0; i < branchSize; ++i) branch->child[i] = nullptr;

          for (int i = 0; i < leaf->size; ++i) {
            int pos =
                occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                1;
            if (branch->child[pos].getType() == kEmpty)
              branch->child[pos] = new ListLeaf(std::move(leaf->entries[i]));
            else {
              ListLeaf* listLeaf = branch->child[pos].getListLeaf();
              ListNode* newNode = new ListNode(std::move(listLeaf->first));
              listLeaf->first.next = newNode;
              listLeaf->first.entry = std::move(leaf->entries[i]);
              ++listLeaf->count;
            }
          }

          delete leaf;

          ListLeaf* listLeaf;

          int pos = occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
          if (branch->child[pos].getType() == kEmpty) {
            listLeaf = new ListLeaf(std::move(entry));
            branch->child[pos] = listLeaf;
          } else {
            listLeaf = branch->child[pos].getListLeaf();
            ListNode* newNode = new ListNode(std::move(listLeaf->first));
            listLeaf->first.next = newNode;
            listLeaf->first.entry = std::move(entry);
            ++listLeaf->count;
          }

          return std::make_pair(&listLeaf->first.entry.value(), true);
        }

        if (branchSize > 1) {
          // maxsize in one bucket = number of items - (num buckets-1)
          // since each bucket has at least 1 item the largest one can only
          // have all remaining ones After adding the item: If it does not
          // collide
          int maxEntriesPerLeaf = 2 + leaf->size - branchSize;

          if (maxEntriesPerLeaf <= InnerLeaf<1>::capacity()) {
            // all items can go into the smallest leaf size
            for (int i = 0; i < branchSize; ++i)
              branch->child[i] = new InnerLeaf<1>;

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                  compute_hash(leaf->entries[i].key()), hashPos + 1,
                  leaf->entries[i]);
            }

            delete leaf;

            int pos =
                occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
            return branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                hash, hashPos + 1, entry);
          } else {
            // there are many collisions, determine the exact sizes first
            std::array<uint8_t, InnerLeaf<4>::capacity() + 1> sizes = {};
            sizes[occupation.num_set_until(hashChunk) - 1] += 1;
            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              sizes[pos] += 1;
            }

            for (int i = 0; i < branchSize; ++i) {
              switch (entries_to_size_class(sizes[i])) {
                case 1:
                  branch->child[i] = new InnerLeaf<1>;
                  break;
                case 2:
                  branch->child[i] = new InnerLeaf<2>;
                  break;
                case 3:
                  branch->child[i] = new InnerLeaf<3>;
                  break;
                case 4:
                  branch->child[i] = new InnerLeaf<4>;
                  break;
                default:
                  // Unexpected result from 'entries_to_size_class'
                  assert(false);
              }
            }

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;

              switch (branch->child[pos].getType()) {
                case kInnerLeafSizeClass1:
                  branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass2:
                  branch->child[pos].getInnerLeafSizeClass2()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass3:
                  branch->child[pos].getInnerLeafSizeClass3()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass4:
                  branch->child[pos].getInnerLeafSizeClass4()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                default:
                  break;
              }
            }
          }

          delete leaf;

          int pos = occupation.num_set_until(hashChunk) - 1;
          insertNode = &branch->child[pos];
          ++hashPos;
        } else {
          // extremely unlikely that the new branch node only gets one
          // child in that case create it and defer the insertion into
          // the next depth
          branch->child[0] = leaf;
          insertNode = &branch->child[0];
          ++hashPos;
          leaf->rehash(hashPos);
        }

        break;
      }
      case kBranchNode: {
        BranchNode* branch = insertNode->getBranchNode();

        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos));

        if (branch->occupation.test(get_hash_chunk(hash, hashPos))) {
          --location;
        } else {
          branch = addChildToBranchNode(branch, get_hash_chunk(hash, hashPos),
                                        location);

          branch->child[location] = nullptr;
          branch->occupation.set(get_hash_chunk(hash, hashPos));
        }

        *insertNode = branch;
        insertNode = &branch->child[location];
        ++hashPos;
      }
    }

    return insert_recurse(insertNode, hash, hashPos, entry);
  }